

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzbdstrmatrix.cpp
# Opt level: O3

int __thiscall
TPZBlockDiagonalStructMatrix<std::complex<double>,_TPZStructMatrixOR<std::complex<double>_>_>::
ClassId(TPZBlockDiagonalStructMatrix<std::complex<double>,_TPZStructMatrixOR<std::complex<double>_>_>
        *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"TPZBlockDiagonalStructMatrix","");
  uVar1 = Hash(&local_40);
  iVar2 = TPZStructMatrix::ClassId((TPZStructMatrix *)this);
  iVar3 = TPZStructMatrixOR<std::complex<double>_>::ClassId
                    ((TPZStructMatrixOR<std::complex<double>_> *)
                     &(this->super_TPZStructMatrixT<std::complex<double>_>).super_TPZStructMatrix.
                      field_0xa0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return iVar3 << 2 ^ iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZBlockDiagonalStructMatrix<TVar,TPar>::ClassId() const{
    return Hash("TPZBlockDiagonalStructMatrix") ^
        TPZStructMatrix::ClassId() << 1 ^
        TPar::ClassId() << 2;
}